

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::DepthShader::shadeFragments
          (DepthShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  UniformSlot *pUVar6;
  GenericVec4 *pGVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  if (0 < numPackets) {
    pUVar6 = this->u_color;
    dVar1 = (pUVar6->value).i;
    dVar2 = (pUVar6->value).i4[1];
    dVar3 = (pUVar6->value).i4[2];
    dVar4 = (pUVar6->value).i4[3];
    pGVar7 = context->outputArray;
    iVar5 = context->numFragmentOutputs;
    iVar8 = 0;
    uVar9 = 0;
    do {
      lVar10 = 4;
      iVar11 = iVar8;
      do {
        pGVar7[iVar11].v.uData[0] = dVar1;
        pGVar7[iVar11].v.uData[1] = dVar2;
        pGVar7[iVar11].v.uData[2] = dVar3;
        pGVar7[iVar11].v.uData[3] = dVar4;
        iVar11 = iVar11 + iVar5;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      uVar9 = uVar9 + 1;
      iVar8 = iVar8 + iVar5 * 4;
    } while (uVar9 != (uint)numPackets);
  }
  return;
}

Assistant:

void DepthShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 color(u_color.value.f4);

	DE_UNREF(packets);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}